

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O0

int Sto_ManChangeLastClause(Sto_Man_t *p)

{
  Sto_Cls_t *local_20;
  Sto_Cls_t *pPrev;
  Sto_Cls_t *pClause;
  Sto_Man_t *p_local;
  
  local_20 = (Sto_Cls_t *)0x0;
  for (pPrev = p->pHead; pPrev != (Sto_Cls_t *)0x0; pPrev = pPrev->pNext) {
    local_20 = pPrev;
  }
  if (local_20 == (Sto_Cls_t *)0x0) {
    __assert_fail("pPrev != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satStore.c"
                  ,0x11d,"int Sto_ManChangeLastClause(Sto_Man_t *)");
  }
  if ((*(uint *)&local_20->field_0x1c & 1) != 1) {
    __assert_fail("pPrev->fA == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satStore.c"
                  ,0x11e,"int Sto_ManChangeLastClause(Sto_Man_t *)");
  }
  if ((*(uint *)&local_20->field_0x1c >> 3 & 0xffffff) == 1) {
    p->nClausesA = p->nClausesA + -1;
    *(uint *)&local_20->field_0x1c = *(uint *)&local_20->field_0x1c & 0xfffffffe;
    return *(int *)&local_20[1].pNext >> 1;
  }
  __assert_fail("pPrev->nLits == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satStore.c"
                ,0x11f,"int Sto_ManChangeLastClause(Sto_Man_t *)");
}

Assistant:

int Sto_ManChangeLastClause( Sto_Man_t * p )
{
    Sto_Cls_t * pClause, * pPrev;
    pPrev = NULL;
    Sto_ManForEachClause( p, pClause )
        pPrev = pClause;
    assert( pPrev != NULL );
    assert( pPrev->fA == 1 );
    assert( pPrev->nLits == 1 );
    p->nClausesA--;
    pPrev->fA = 0;
    return pPrev->pLits[0] >> 1;
}